

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHBuiltinVerifier_Test::TestBody
          (SSLTest_ECHBuiltinVerifier_Test *this)

{
  bool bVar1;
  char *pcVar2;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  pointer psVar3;
  X509_STORE *pXVar4;
  X509 *x;
  X509_VERIFY_PARAM *pXVar5;
  const_iterator pbVar6;
  pointer server_ctx_00;
  pointer psVar7;
  pointer keys_00;
  SSL *pSVar8;
  EVP_PKEY *pkey;
  pointer server_00;
  char *in_R9;
  X509 *local_610;
  SSL_ECH_KEYS *local_5d0;
  AssertHelper local_558;
  Message local_550;
  long local_548;
  int local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar;
  AssertHelper local_508;
  Message local_500;
  int local_4f4;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_4c0;
  Message local_4b8;
  int local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_478;
  Message local_470;
  bool local_461;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_430;
  Message local_428;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__12;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_3d8;
  Message local_3d0;
  int local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__11;
  ScopedTrace gtest_trace_2436;
  bool use_leaf_secret;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<bool> local_390;
  initializer_list<bool> *local_380;
  initializer_list<bool> *__range3;
  ScopedTrace gtest_trace_2434;
  const_iterator pbStack_370;
  bool accept_ech;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_358;
  initializer_list<bool> *local_348;
  initializer_list<bool> *__range2;
  AssertHelper local_320;
  Message local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2d8;
  Message local_2d0;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<X509_STORE> store;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<SSL_CTX> client_ctx;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<SSL_CTX> server_ctx;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<SSL_ECH_KEYS> wrong_keys;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL_ECH_KEYS> keys;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<X509> leaf_secret;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> leaf_public;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY> leaf_key;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509> root;
  SSLTest_ECHBuiltinVerifier_Test *this_local;
  
  CertFromPEM((anon_unknown_0 *)&gtest_ar_.message_,
              "\n-----BEGIN CERTIFICATE-----\nMIIBRzCB7aADAgECAgEBMAoGCCqGSM49BAMCMBIxEDAOBgNVBAMTB1Rlc3QgQ0Ew\nIBcNMDAwMTAxMDAwMDAwWhgPMjA5OTAxMDEwMDAwMDBaMBIxEDAOBgNVBAMTB1Rl\nc3QgQ0EwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAAT5JUjrI1DAxSpEl88UkmJw\ntAJqxo/YrSFo9V3MkcNkfTixi5p6MUtO8DazhEgekBcd2+tBAWtl7dy0qpvTqx92\nozIwMDAPBgNVHRMBAf8EBTADAQH/MB0GA1UdDgQWBBTw6ftkexAI6o4r5FntJIfL\nGU5F4zAKBggqhkjOPQQDAgNJADBGAiEAiiNowddQeHZaZFIygwe6RW5/WG4sUXWC\ndkyl9CQzRaYCIQCFS1EvwZbZtMny27fYm1eeYciY0TkJTEi34H1KwyzzIA==\n-----END CERTIFICATE-----\n"
             );
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x5008d7,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x940,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    KeyFromPEM((anon_unknown_0 *)&gtest_ar__1.message_,
               "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgj5WKHwHnziiyPauf\n7QukxTwtTyGZkk8qNdms4puJfxqhRANCAARNrkhxabALDlJrHtvkuDwvCWUF/oVC\nhr6PDITHi1lDlJzvVT4aXBH87sH2n2UV5zpx13NHkq1bIC8eRT8eOIe0\n-----END PRIVATE KEY-----\n"
              );
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&leaf_public,(internal *)local_88,(AssertionResult *)"leaf_key","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x948,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&leaf_public);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      CertFromPEM((anon_unknown_0 *)&gtest_ar__2.message_,
                  "\n-----BEGIN CERTIFICATE-----\nMIIBaDCCAQ6gAwIBAgIBAjAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB\nMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5w\ndWJsaWMuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO\nUmse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg\nLx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO\nK+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOcHVibGljLmV4YW1wbGUwCgYIKoZIzj0E\nAwIDSAAwRQIhANqZRhDR/+QL05hsWXMYEwaiHifd9iakKoFEhKFchcF3AiBRAeXw\nwRGGT6+iPmTYM6N5/IDyAb5B9Ke38O6lLEsUwA==\n-----END CERTIFICATE-----\n"
                 );
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&leaf_secret,(internal *)local_d0,(AssertionResult *)"leaf_public",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x955,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&leaf_secret);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        CertFromPEM((anon_unknown_0 *)&gtest_ar__3.message_,
                    "\n-----BEGIN CERTIFICATE-----\nMIIBaTCCAQ6gAwIBAgIBAzAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB\nMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5z\nZWNyZXQuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO\nUmse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg\nLx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO\nK+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOc2VjcmV0LmV4YW1wbGUwCgYIKoZIzj0E\nAwIDSQAwRgIhAPQdIz1xCFkc9WuSkxOxJDpywZiEp9SnKcxJ9nwrlRp3AiEA+O3+\nXRqE7XFhHL+7TNC2a9OOAjQsEF137YPWo+rhgko=\n-----END CERTIFICATE-----\n"
                   );
        testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,(type *)0x0
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&keys,(internal *)local_118,(AssertionResult *)"leaf_secret","false",
                     "true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x962,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&keys);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          MakeTestECHKeys((anon_unknown_0 *)&gtest_ar__4.message_,'\x01');
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&wrong_keys,(internal *)local_160,(AssertionResult *)0x4dabc5,
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x967,pcVar2);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&wrong_keys);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            MakeTestECHKeys((anon_unknown_0 *)&gtest_ar__5.message_,'\x02');
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1a8,
                       (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_
                       ,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&server_ctx,(internal *)local_1a8,(AssertionResult *)"wrong_keys"
                         ,"false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x969,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&server_ctx);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            if (bVar1) {
              method = TLS_method();
              CreateContextWithTestCertificate((anon_unknown_0 *)&gtest_ar__6.message_,method);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_1f0,
                         (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&client_ctx,(internal *)local_1f0,
                           (AssertionResult *)"server_ctx","false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x96c,pcVar2);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&client_ctx);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (bVar1) {
                meth = (SSL_METHOD *)TLS_method();
                psVar3 = (pointer)SSL_CTX_new(meth);
                std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           psVar3);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_238,
                           (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_238);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&store,(internal *)local_238,(AssertionResult *)"client_ctx",
                             "false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x96e,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  std::__cxx11::string::~string((string *)&store);
                  testing::Message::~Message(&local_240);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                if (bVar1) {
                  pXVar4 = X509_STORE_new();
                  std::unique_ptr<x509_store_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<x509_store_st,bssl::internal::Deleter> *)
                             &gtest_ar__8.message_,(pointer)pXVar4);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<x509_store_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_280,
                             (unique_ptr<x509_store_st,_bssl::internal::Deleter> *)
                             &gtest_ar__8.message_,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_280);
                  if (!bVar1) {
                    testing::Message::Message(&local_288);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_280,
                               (AssertionResult *)"store","false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_290,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x974,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_290,&local_288);
                    testing::internal::AssertHelper::~AssertHelper(&local_290);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_288);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                  if (bVar1) {
                    pXVar4 = (X509_STORE *)
                             std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<x509_store_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__8.message_);
                    x = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar_.message_);
                    local_2c4 = X509_STORE_add_cert(pXVar4,x);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_2c0,&local_2c4,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2c0);
                    if (!bVar1) {
                      testing::Message::Message(&local_2d0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_2c0,
                                 (AssertionResult *)"X509_STORE_add_cert(store.get(), root.get())",
                                 "false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x975,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_2d0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
                    if (bVar1) {
                      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      pXVar4 = (X509_STORE *)
                               std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::release
                                         ((unique_ptr<x509_store_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__8.message_);
                      SSL_CTX_set_cert_store((SSL_CTX *)psVar3,pXVar4);
                      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      SSL_CTX_set_verify((SSL_CTX *)psVar3,1,(callback *)0x0);
                      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      pXVar5 = SSL_CTX_get0_param(psVar3);
                      X509_VERIFY_PARAM_set_flags((X509_VERIFY_PARAM *)pXVar5,0x200000);
                      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      pXVar5 = SSL_CTX_get0_param(psVar3);
                      local_30c = X509_VERIFY_PARAM_set1_host(pXVar5,"secret.example",0xe);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_308,&local_30c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_308);
                      if (!bVar1) {
                        testing::Message::Message(&local_318);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&__range2,(internal *)local_308,
                                   (AssertionResult *)
                                   "X509_VERIFY_PARAM_set1_host(SSL_CTX_get0_param(client_ctx.get()), kSecretName, strlen(kSecretName))"
                                   ,"false","true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_320,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x97c,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_320,&local_318);
                        testing::internal::AssertHelper::~AssertHelper(&local_320);
                        std::__cxx11::string::~string((string *)&__range2);
                        testing::Message::~Message(&local_318);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
                      if (bVar1) {
                        __begin2._6_1_ = 0;
                        __begin2._7_1_ = 1;
                        local_358._M_array = (iterator)((long)&__begin2 + 6);
                        local_358._M_len = 2;
                        local_348 = &local_358;
                        __end2 = std::initializer_list<bool>::begin(local_348);
                        pbStack_370 = std::initializer_list<bool>::end(local_348);
                        for (; __end2 != pbStack_370; __end2 = __end2 + 1) {
                          __range3._7_1_ = *__end2 & 1;
                          testing::ScopedTrace::ScopedTrace<bool>
                                    ((ScopedTrace *)((long)&__range3 + 6),
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x982,(bool *)((long)&__range3 + 7));
                          __begin3._6_1_ = 0;
                          __begin3._7_1_ = 1;
                          local_390._M_array = (iterator)((long)&__begin3 + 6);
                          local_390._M_len = 2;
                          local_380 = &local_390;
                          __end3 = std::initializer_list<bool>::begin(local_380);
                          pbVar6 = std::initializer_list<bool>::end(local_380);
                          for (; __end3 != pbVar6; __end3 = __end3 + 1) {
                            gtest_ar__11.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._7_1_ = *__end3 & 1;
                            testing::ScopedTrace::ScopedTrace<bool>
                                      ((ScopedTrace *)
                                       ((long)&gtest_ar__11.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 6),
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x984,(bool *)((long)&gtest_ar__11.message_._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__6.message_);
                            if ((__range3._7_1_ & 1) == 0) {
                              local_5d0 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                          ::get((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar__5.message_);
                            }
                            else {
                              local_5d0 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                          ::get((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar__4.message_);
                            }
                            local_3c4 = SSL_CTX_set1_ech_keys(psVar3,local_5d0);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_3c0,&local_3c4,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3c0);
                            if (!bVar1) {
                              testing::Message::Message(&local_3d0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&client,(internal *)local_3c0,
                                         (AssertionResult *)
                                         "SSL_CTX_set1_ech_keys( server_ctx.get(), accept_ech ? keys.get() : wrong_keys.get())"
                                         ,"false","true",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_3d8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x988,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
                              testing::internal::AssertHelper::~AssertHelper(&local_3d8);
                              std::__cxx11::string::~string((string *)&client);
                              testing::Message::~Message(&local_3d0);
                            }
                            bVar1 = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0)
                            ;
                            if (!bVar1) {
                              std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                              unique_ptr<bssl::internal::Deleter,void>
                                        ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
                              std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                              unique_ptr<bssl::internal::Deleter,void>
                                        ((unique_ptr<ssl_st,bssl::internal::Deleter> *)
                                         &gtest_ar__12.message_);
                              psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *
                                                  )&gtest_ar__7.message_);
                              server_ctx_00 =
                                   std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__6.message_);
                              local_419 = CreateClientAndServer
                                                    (&server,(UniquePtr<SSL> *)
                                                             &gtest_ar__12.message_,psVar3,
                                                     server_ctx_00);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_418,&local_419,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_418);
                              if (!bVar1) {
                                testing::Message::Message(&local_428);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__13.message_,(internal *)local_418,
                                           (AssertionResult *)
                                           "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                                           ,"false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_430,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x98c,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_430,&local_428);
                                testing::internal::AssertHelper::~AssertHelper(&local_430);
                                std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                                testing::Message::~Message(&local_428);
                              }
                              bVar1 = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_418);
                              if (!bVar1) {
                                psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                   (&server);
                                keys_00 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                          ::get((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar__4.message_);
                                local_461 = InstallECHConfigList(psVar7,keys_00);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_460,&local_461,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_460);
                                if (!bVar1) {
                                  testing::Message::Message(&local_470);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__14.message_,(internal *)local_460,
                                             (AssertionResult *)
                                             "InstallECHConfigList(client.get(), keys.get())",
                                             "false","true",in_R9);
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_478,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                             ,0x98d,pcVar2);
                                  testing::internal::AssertHelper::operator=(&local_478,&local_470);
                                  testing::internal::AssertHelper::~AssertHelper(&local_478);
                                  std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                                  testing::Message::~Message(&local_470);
                                }
                                bVar1 = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_460);
                                if (!bVar1) {
                                  pSVar8 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::
                                                  get((unique_ptr<ssl_st,_bssl::internal::Deleter> *
                                                      )&gtest_ar__12.message_);
                                  if ((gtest_ar__11.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._7_1_ & 1) == 0) {
                                    local_610 = (X509 *)std::
                                                  unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                            ((
                                                  unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__2.message_);
                                  }
                                  else {
                                    local_610 = (X509 *)std::
                                                  unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                            ((
                                                  unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__3.message_);
                                  }
                                  local_4ac = SSL_use_certificate(pSVar8,local_610);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_4a8,&local_4ac,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_4a8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_4b8);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__15.message_,
                                               (internal *)local_4a8,
                                               (AssertionResult *)
                                               "SSL_use_certificate(server.get(), use_leaf_secret ? leaf_secret.get() : leaf_public.get())"
                                               ,"false","true",in_R9);
                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_4c0,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                               ,0x992,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              (&local_4c0,&local_4b8);
                                    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
                                    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                                    testing::Message::~Message(&local_4b8);
                                  }
                                  bVar1 = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_4a8);
                                  if (!bVar1) {
                                    pSVar8 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>
                                                    ::get((
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__12.message_);
                                    pkey = (EVP_PKEY *)
                                           std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::
                                           get((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__1.message_);
                                    local_4f4 = SSL_use_PrivateKey(pSVar8,pkey);
                                    testing::AssertionResult::AssertionResult<int>
                                              ((AssertionResult *)local_4f0,&local_4f4,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4f0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_500);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar.message_,(internal *)local_4f0,
                                                 (AssertionResult *)
                                                 "SSL_use_PrivateKey(server.get(), leaf_key.get())",
                                                 "false","true",in_R9);
                                      pcVar2 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_508,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                 ,0x993,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                (&local_508,&local_500);
                                      testing::internal::AssertHelper::~AssertHelper(&local_508);
                                      std::__cxx11::string::~string((string *)&gtest_ar.message_);
                                      testing::Message::~Message(&local_500);
                                    }
                                    bVar1 = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4f0);
                                    if (!bVar1) {
                                      psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                         (&server);
                                      server_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::
                                                  get((unique_ptr<ssl_st,_bssl::internal::Deleter> *
                                                      )&gtest_ar__12.message_);
                                      CompleteHandshakes(psVar7,server_00);
                                      local_53c = 0x3e;
                                      if ((__range3._7_1_ & 1) ==
                                          (gtest_ar__11.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._7_1_ & 1)) {
                                        local_53c = 0;
                                      }
                                      pSVar8 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&server);
                                      local_548 = SSL_get_verify_result(pSVar8);
                                      testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                                ((EqHelper *)local_538,
                                                 "accept_ech == use_leaf_secret ? 0 : 62",
                                                 "SSL_get_verify_result(client.get())",&local_53c,
                                                 &local_548);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_538);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_550);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_538);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_558,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x99a,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_558,&local_550);
                                        testing::internal::AssertHelper::~AssertHelper(&local_558);
                                        testing::Message::~Message(&local_550);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_538);
                                      bVar1 = false;
                                    }
                                  }
                                }
                              }
                              std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                        ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__12.message_);
                              std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server)
                              ;
                            }
                            testing::ScopedTrace::~ScopedTrace
                                      ((ScopedTrace *)
                                       ((long)&gtest_ar__11.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 6));
                            if (bVar1) goto LAB_0018f88d;
                          }
                          bVar1 = false;
LAB_0018f88d:
                          testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range3 + 6));
                          if (bVar1) break;
                        }
                      }
                    }
                  }
                  std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<x509_store_st,_bssl::internal::Deleter> *)
                             &gtest_ar__8.message_);
                }
                std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_)
                ;
              }
              std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
            }
            std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_
                      );
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ECHBuiltinVerifier) {
  // These test certificates generated with the following Go program.
  /* clang-format off
func main() {
  notBefore := time.Date(2000, time.January, 1, 0, 0, 0, 0, time.UTC)
  notAfter := time.Date(2099, time.January, 1, 0, 0, 0, 0, time.UTC)
  rootKey, _ := ecdsa.GenerateKey(elliptic.P256(), rand.Reader)
  rootTemplate := &x509.Certificate{
    SerialNumber:          big.NewInt(1),
    Subject:               pkix.Name{CommonName: "Test CA"},
    NotBefore:             notBefore,
    NotAfter:              notAfter,
    BasicConstraintsValid: true,
    IsCA:                  true,
  }
  rootDER, _ := x509.CreateCertificate(rand.Reader, rootTemplate, rootTemplate, &rootKey.PublicKey, rootKey)
  root, _ := x509.ParseCertificate(rootDER)
  pem.Encode(os.Stdout, &pem.Block{Type: "CERTIFICATE", Bytes: rootDER})
  leafKey, _ := ecdsa.GenerateKey(elliptic.P256(), rand.Reader)
  leafKeyDER, _ := x509.MarshalPKCS8PrivateKey(leafKey)
  pem.Encode(os.Stdout, &pem.Block{Type: "PRIVATE KEY", Bytes: leafKeyDER})
  for i, name := range []string{"public.example", "secret.example"} {
    leafTemplate := &x509.Certificate{
      SerialNumber:          big.NewInt(int64(i) + 2),
      Subject:               pkix.Name{CommonName: name},
      NotBefore:             notBefore,
      NotAfter:              notAfter,
      BasicConstraintsValid: true,
      DNSNames:              []string{name},
    }
    leafDER, _ := x509.CreateCertificate(rand.Reader, leafTemplate, root, &leafKey.PublicKey, rootKey)
    pem.Encode(os.Stdout, &pem.Block{Type: "CERTIFICATE", Bytes: leafDER})
  }
}
clang-format on */
  bssl::UniquePtr<X509> root = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBRzCB7aADAgECAgEBMAoGCCqGSM49BAMCMBIxEDAOBgNVBAMTB1Rlc3QgQ0Ew
IBcNMDAwMTAxMDAwMDAwWhgPMjA5OTAxMDEwMDAwMDBaMBIxEDAOBgNVBAMTB1Rl
c3QgQ0EwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAAT5JUjrI1DAxSpEl88UkmJw
tAJqxo/YrSFo9V3MkcNkfTixi5p6MUtO8DazhEgekBcd2+tBAWtl7dy0qpvTqx92
ozIwMDAPBgNVHRMBAf8EBTADAQH/MB0GA1UdDgQWBBTw6ftkexAI6o4r5FntJIfL
GU5F4zAKBggqhkjOPQQDAgNJADBGAiEAiiNowddQeHZaZFIygwe6RW5/WG4sUXWC
dkyl9CQzRaYCIQCFS1EvwZbZtMny27fYm1eeYciY0TkJTEi34H1KwyzzIA==
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(root);
  bssl::UniquePtr<EVP_PKEY> leaf_key = KeyFromPEM(R"(
-----BEGIN PRIVATE KEY-----
MIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgj5WKHwHnziiyPauf
7QukxTwtTyGZkk8qNdms4puJfxqhRANCAARNrkhxabALDlJrHtvkuDwvCWUF/oVC
hr6PDITHi1lDlJzvVT4aXBH87sH2n2UV5zpx13NHkq1bIC8eRT8eOIe0
-----END PRIVATE KEY-----
)");
  ASSERT_TRUE(leaf_key);
  bssl::UniquePtr<X509> leaf_public = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBaDCCAQ6gAwIBAgIBAjAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB
MCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5w
dWJsaWMuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO
Umse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg
Lx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO
K+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOcHVibGljLmV4YW1wbGUwCgYIKoZIzj0E
AwIDSAAwRQIhANqZRhDR/+QL05hsWXMYEwaiHifd9iakKoFEhKFchcF3AiBRAeXw
wRGGT6+iPmTYM6N5/IDyAb5B9Ke38O6lLEsUwA==
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(leaf_public);
  bssl::UniquePtr<X509> leaf_secret = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBaTCCAQ6gAwIBAgIBAzAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB
MCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5z
ZWNyZXQuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO
Umse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg
Lx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO
K+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOc2VjcmV0LmV4YW1wbGUwCgYIKoZIzj0E
AwIDSQAwRgIhAPQdIz1xCFkc9WuSkxOxJDpywZiEp9SnKcxJ9nwrlRp3AiEA+O3+
XRqE7XFhHL+7TNC2a9OOAjQsEF137YPWo+rhgko=
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(leaf_secret);

  // Use different config IDs so that fuzzer mode, which breaks trial
  // decryption, will observe the key mismatch.
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys(/*config_id=*/1);
  ASSERT_TRUE(keys);
  bssl::UniquePtr<SSL_ECH_KEYS> wrong_keys = MakeTestECHKeys(/*config_id=*/2);
  ASSERT_TRUE(wrong_keys);
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);

  // Configure the client to verify certificates and expect the secret name.
  // This is the name the client is trying to connect to. If ECH is rejected,
  // BoringSSL will internally override this setting with the public name.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_add_cert(store.get(), root.get()));
  SSL_CTX_set_cert_store(client_ctx.get(), store.release());
  SSL_CTX_set_verify(client_ctx.get(), SSL_VERIFY_PEER, nullptr);
  X509_VERIFY_PARAM_set_flags(SSL_CTX_get0_param(client_ctx.get()),
                              X509_V_FLAG_NO_CHECK_TIME);
  static const char kSecretName[] = "secret.example";
  ASSERT_TRUE(X509_VERIFY_PARAM_set1_host(SSL_CTX_get0_param(client_ctx.get()),
                                          kSecretName, strlen(kSecretName)));

  // For simplicity, we only run through a pair of representative scenarios here
  // and rely on runner.go to verify that |SSL_get0_ech_name_override| behaves
  // correctly.
  for (bool accept_ech : {false, true}) {
    SCOPED_TRACE(accept_ech);
    for (bool use_leaf_secret : {false, true}) {
      SCOPED_TRACE(use_leaf_secret);

      // The server will reject ECH when configured with the wrong keys.
      ASSERT_TRUE(SSL_CTX_set1_ech_keys(
          server_ctx.get(), accept_ech ? keys.get() : wrong_keys.get()));

      bssl::UniquePtr<SSL> client, server;
      ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                        server_ctx.get()));
      ASSERT_TRUE(InstallECHConfigList(client.get(), keys.get()));

      // Configure the server with the selected certificate.
      ASSERT_TRUE(SSL_use_certificate(server.get(), use_leaf_secret
                                                        ? leaf_secret.get()
                                                        : leaf_public.get()));
      ASSERT_TRUE(SSL_use_PrivateKey(server.get(), leaf_key.get()));

      // The handshake may fail due to name mismatch or ECH reject. We check
      // |SSL_get_verify_result| to confirm the handshake got far enough.
      CompleteHandshakes(client.get(), server.get());
      EXPECT_EQ(accept_ech == use_leaf_secret ? X509_V_OK
                                              : X509_V_ERR_HOSTNAME_MISMATCH,
                SSL_get_verify_result(client.get()));
    }
  }
}